

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<unsigned_long>::Clear
          (RepeatedFieldWrapper<unsigned_long> *this,Field *data)

{
  ulong uVar1;
  int iVar2;
  LongSooRep *this_00;
  bool is_soo;
  
  this_00 = (LongSooRep *)(**(code **)(*(long *)this + 0x88))();
  uVar1 = this_00->elements_int;
  if ((uVar1 & 4) != 0) {
    LongSooRep::elements(this_00);
  }
  is_soo = (uVar1 & 4) == 0;
  SooRep::size((SooRep *)this_00,is_soo);
  iVar2 = SooRep::size((SooRep *)this_00,is_soo);
  if ((iVar2 != 0) && ((this_00->elements_int & 4) != 0)) {
    LongSooRep::elements(this_00);
  }
  RepeatedField<unsigned_long>::set_size((RepeatedField<unsigned_long> *)this_00,(uVar1 & 4) == 0,0)
  ;
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }